

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O3

size_t utf8::CharacterIndexToByteIndex
                 (LPCUTF8 pch,size_t cbLength,charcount_t cchIndex,size_t cbStartIndex,
                 charcount_t cchStartIndex,DecodeOptions options)

{
  uint *end;
  uint *puVar1;
  size_t sVar2;
  uint uVar3;
  bool bVar4;
  uint *local_40;
  DecodeOptions local_34 [2];
  DecodeOptions localOptions;
  
  local_40 = (uint *)(pch + cbStartIndex);
  end = (uint *)(pch + cbLength);
  uVar3 = cchIndex - cchStartIndex;
  local_34[0] = options;
  if (((ulong)local_40 & 3) != 0) goto LAB_0068c9e6;
  do {
    if ((local_40 < pch + (cbLength - 4)) && (4 < uVar3)) {
      while ((*local_40 & 0x80808080) == 0) {
        local_40 = local_40 + 1;
        uVar3 = uVar3 - 4;
        if ((pch + (cbLength - 4) <= local_40) || (uVar3 < 5)) break;
      }
    }
LAB_0068c9e6:
    bVar4 = uVar3 != 0;
    if ((end <= local_40) || (uVar3 == 0)) {
LAB_0068ca48:
      sVar2 = (long)local_40 - (long)pch;
      if (bVar4) {
        sVar2 = cbLength;
      }
      return sVar2;
    }
    puVar1 = local_40;
    while( true ) {
      uVar3 = uVar3 - 1;
      local_40 = (uint *)((long)puVar1 + 1);
      if ((char)(byte)*puVar1 < '\0') {
        DecodeTail((ushort)(byte)*puVar1,(LPCUTF8 *)&local_40,(LPCUTF8)end,local_34,(bool *)0x0);
      }
      if ((4 < uVar3) && (((ulong)local_40 & 3) == 0)) break;
      bVar4 = uVar3 != 0;
      if ((end <= local_40) || (puVar1 = local_40, !bVar4)) goto LAB_0068ca48;
    }
  } while( true );
}

Assistant:

size_t CharacterIndexToByteIndex(__in_ecount(cbLength) LPCUTF8 pch, size_t cbLength, const charcount_t cchIndex, size_t cbStartIndex, charcount_t cchStartIndex, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        LPCUTF8 pchCurrent = pch + cbStartIndex;
        LPCUTF8 pchEnd = pch + cbLength;
        LPCUTF8 pchEndMinus4 = pch + (cbLength - 4);
        charcount_t i = cchIndex - cchStartIndex;

        // Avoid using a reinterpret_cast to start a misaligned read.
        if (!IsAligned(pchCurrent)) goto LSlowPath;
LFastPath:
        // Skip 4 bytes at a time.
        while (pchCurrent < pchEndMinus4 && i > 4)
        {
            uint32 ch4 = *reinterpret_cast<const uint32 *>(pchCurrent);
            if ((ch4 & 0x80808080) == 0)
            {
                pchCurrent += 4;
                i -= 4;
            }
            else break;
        }

LSlowPath:
        while (pchCurrent < pchEnd && i > 0)
        {
            Decode(pchCurrent, pchEnd, localOptions);
            i--;

            // Try to return to the fast path avoiding misaligned reads.
            if (i > 4 && IsAligned(pchCurrent)) goto LFastPath;
        }
        return i > 0 ? cbLength : pchCurrent - pch;
    }